

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtExternalObject.cpp
# Opt level: O0

JsrtExternalObject *
JsrtExternalObject::Create
          (void *data,uint inlineSlotSize,JsFinalizeCallback finalizeCallback,
          RecyclableObject *prototype,ScriptContext *scriptContext,JsrtExternalType *type)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  JavascriptLibrary *pJVar4;
  Recycler *pRVar5;
  JsrtExternalType *this;
  undefined4 *puVar6;
  JsrtExternalObject *pJVar7;
  TrackAllocData local_d8;
  code *local_b0;
  undefined8 local_a8;
  TrackAllocData local_a0;
  JsrtExternalObject *local_78;
  JsrtExternalObject *externalObject;
  undefined8 local_68;
  TrackAllocData local_60;
  JsrtExternalType *local_38;
  JsrtExternalType *type_local;
  ScriptContext *scriptContext_local;
  RecyclableObject *prototype_local;
  JsFinalizeCallback finalizeCallback_local;
  void *pvStack_10;
  uint inlineSlotSize_local;
  void *data_local;
  
  local_38 = type;
  type_local = (JsrtExternalType *)scriptContext;
  scriptContext_local = (ScriptContext *)prototype;
  prototype_local = (RecyclableObject *)finalizeCallback;
  finalizeCallback_local._4_4_ = inlineSlotSize;
  pvStack_10 = data;
  if (prototype == (RecyclableObject *)0x0) {
    pJVar4 = Js::ScriptContext::GetLibrary(scriptContext);
    scriptContext_local =
         (ScriptContext *)
         Js::JavascriptLibraryBase::GetObjectPrototype(&pJVar4->super_JavascriptLibraryBase);
  }
  if (local_38 == (JsrtExternalType *)0x0) {
    pJVar4 = Js::ScriptContext::GetLibrary((ScriptContext *)type_local);
    local_38 = Js::JavascriptLibrary::GetCachedJsrtExternalType
                         (pJVar4,0,(uintptr_t)prototype_local,(uintptr_t)scriptContext_local);
    if (local_38 == (JsrtExternalType *)0x0) {
      pRVar5 = Js::ScriptContext::GetRecycler((ScriptContext *)type_local);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_60,(type_info *)&JsrtExternalType::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtExternalObject.cpp"
                 ,0x88);
      pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_60);
      externalObject = (JsrtExternalObject *)Memory::Recycler::AllocInlined;
      local_68 = 0;
      this = (JsrtExternalType *)new<Memory::Recycler>(0x48,pRVar5,0x43c4b0);
      JsrtExternalType::JsrtExternalType
                (this,(ScriptContext *)type_local,(JsFinalizeCallback)prototype_local,
                 (RecyclableObject *)scriptContext_local);
      local_38 = this;
      pJVar4 = Js::ScriptContext::GetLibrary((ScriptContext *)type_local);
      Js::JavascriptLibrary::CacheJsrtExternalType
                (pJVar4,0,(uintptr_t)prototype_local,(uintptr_t)scriptContext_local,local_38);
    }
  }
  BVar3 = Js::Type::IsJsrtExternal((Type *)local_38);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtExternalObject.cpp"
                       ,0x91,"(type->IsJsrtExternal())","type->IsJsrtExternal()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (prototype_local == (RecyclableObject *)0x0) {
    pRVar5 = Js::ScriptContext::GetRecycler((ScriptContext *)type_local);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_d8,(type_info *)&typeinfo,(ulong)finalizeCallback_local._4_4_,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtExternalObject.cpp"
               ,0x9a);
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_d8);
    pJVar7 = (JsrtExternalObject *)new<Memory::Recycler>(0x30,pRVar5,0x446fd0,0);
    JsrtExternalObject(pJVar7,local_38,pvStack_10,finalizeCallback_local._4_4_);
    local_78 = pJVar7;
  }
  else {
    pRVar5 = Js::ScriptContext::GetRecycler((ScriptContext *)type_local);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_a0,(type_info *)&typeinfo,(ulong)finalizeCallback_local._4_4_,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtExternalObject.cpp"
               ,0x96);
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_a0);
    local_b0 = Memory::Recycler::AllocFinalized;
    local_a8 = 0;
    pJVar7 = (JsrtExternalObject *)new<Memory::Recycler>(0x30,pRVar5,0x48f150,0);
    JsrtExternalObject(pJVar7,local_38,pvStack_10,finalizeCallback_local._4_4_);
    local_78 = pJVar7;
  }
  return local_78;
}

Assistant:

JsrtExternalObject* JsrtExternalObject::Create(void *data, uint inlineSlotSize, JsFinalizeCallback finalizeCallback, Js::RecyclableObject * prototype, Js::ScriptContext *scriptContext, JsrtExternalType * type)
{
    if (prototype == nullptr)
    {
        prototype = scriptContext->GetLibrary()->GetObjectPrototype();
    }
    if (type == nullptr)
    {
#ifdef _CHAKRACOREBUILD
        type = scriptContext->GetLibrary()->GetCachedJsrtExternalType(0, reinterpret_cast<uintptr_t>(finalizeCallback), reinterpret_cast<uintptr_t>(prototype));
#else
        type = scriptContext->GetLibrary()->GetCachedJsrtExternalType(reinterpret_cast<uintptr_t>(finalizeCallback), reinterpret_cast<uintptr_t>(prototype));
#endif

        if (type == nullptr)
        {
            type = RecyclerNew(scriptContext->GetRecycler(), JsrtExternalType, scriptContext, finalizeCallback, prototype);
#ifdef _CHAKRACOREBUILD
            scriptContext->GetLibrary()->CacheJsrtExternalType(0, reinterpret_cast<uintptr_t>(finalizeCallback), reinterpret_cast<uintptr_t>(prototype), type);
#else
            scriptContext->GetLibrary()->CacheJsrtExternalType(reinterpret_cast<uintptr_t>(finalizeCallback), reinterpret_cast<uintptr_t>(prototype), type);
#endif
        }
    }

    Assert(type->IsJsrtExternal());

    JsrtExternalObject * externalObject;
    if (finalizeCallback != nullptr)
    {
        externalObject = RecyclerNewFinalizedPlus(scriptContext->GetRecycler(), inlineSlotSize, JsrtExternalObject, static_cast<JsrtExternalType*>(type), data, inlineSlotSize);
    }
    else
    {
        externalObject = RecyclerNewPlus(scriptContext->GetRecycler(), inlineSlotSize, JsrtExternalObject, static_cast<JsrtExternalType*>(type), data, inlineSlotSize);
    }

    return externalObject;
}